

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::StringMakerBase<true>::convert<std::atomic<unsigned_long>>
                   (atomic<unsigned_long> *in)

{
  String *in_RDI;
  
  filloss<std::atomic<unsigned_long>>((atomic<unsigned_long> *)0x1a73c5);
  getTlsOssResult();
  return in_RDI;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
            /* When parameter "in" is a null terminated const char* it works.
	     * When parameter "in" is a T arr[N] without '\0' we can fill the
             * stringstream with N objects (T=char).If in is char pointer *
             * without '\0' , it would cause segfault
	     * stepping over unaccessible memory.
             */

            filloss(in);
            return getTlsOssResult();
        }